

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

void parseCommandLine(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined4 *puVar4;
  long lVar5;
  int anon_var_0;
  int temp;
  char *parm_1;
  char *parm;
  int argnum;
  char **argv_local;
  int argc_local;
  
  gRunInfo.doGrammarCaching = false;
  gRunInfo.quiet = false;
  gRunInfo.verbose = false;
  gRunInfo.stopNow = false;
  gRunInfo.dom = false;
  gRunInfo.sax = true;
  gRunInfo.reuseParser = false;
  gRunInfo.inMemory = false;
  gRunInfo.dumpOnErr = false;
  gRunInfo.doSchema = false;
  gRunInfo.schemaFullChecking = false;
  gRunInfo.doNamespaces = false;
  gRunInfo.doInitialParse = false;
  gRunInfo.doNamespacePrefixes = false;
  gRunInfo.valScheme = Val_Auto;
  gRunInfo.numThreads = 2;
  gRunInfo.totalTime = 0;
  gRunInfo.numInputFiles = 0;
  gRunInfo.numParses = 0;
  parm._4_4_ = 1;
  do {
    if (argc <= parm._4_4_) {
      if (gRunInfo.numInputFiles != 0) {
        if ((gRunInfo.numParses != 0) && (gRunInfo.totalTime != 0)) {
          fprintf(_stderr,"Both -parses nnn and -time nnn were specified. Ignoring -time nnn.\n");
        }
        return;
      }
      fprintf(_stderr,"No input XML file specified on command line.\n");
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 1;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
    iVar1 = strcmp(argv[parm._4_4_],"-quiet");
    if (iVar1 == 0) {
      gRunInfo.quiet = true;
      uVar2 = gRunInfo.numParses;
    }
    else {
      iVar1 = strcmp(argv[parm._4_4_],"-verbose");
      if (iVar1 == 0) {
        gRunInfo.verbose = true;
        uVar2 = gRunInfo.numParses;
      }
      else {
        iVar1 = strncmp(argv[parm._4_4_],"-v=",3);
        if (iVar1 == 0) {
          pcVar3 = argv[parm._4_4_] + 3;
          iVar1 = strcmp(pcVar3,"never");
          if (iVar1 == 0) {
            gRunInfo.valScheme = Val_Never;
            uVar2 = gRunInfo.numParses;
          }
          else {
            iVar1 = strcmp(pcVar3,"auto");
            if (iVar1 == 0) {
              gRunInfo.valScheme = Val_Auto;
              uVar2 = gRunInfo.numParses;
            }
            else {
              iVar1 = strcmp(pcVar3,"always");
              if (iVar1 != 0) {
                fprintf(_stderr,"Unrecognized -v option \"%s\"\n",pcVar3);
                puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                *puVar4 = 1;
                __cxa_throw(puVar4,&int::typeinfo,0);
              }
              gRunInfo.valScheme = Val_Always;
              uVar2 = gRunInfo.numParses;
            }
          }
        }
        else {
          iVar1 = strcmp(argv[parm._4_4_],"-v");
          if (iVar1 == 0) {
            fprintf(_stderr,
                    "Please note the -v option has been changed to -v=[always | never | auto]\n");
            fprintf(_stderr,"ThreadTest will continue with -v=always\n");
            gRunInfo.valScheme = Val_Always;
            uVar2 = gRunInfo.numParses;
          }
          else {
            iVar1 = strcmp(argv[parm._4_4_],"-s");
            if (iVar1 == 0) {
              gRunInfo.doSchema = true;
              uVar2 = gRunInfo.numParses;
            }
            else {
              iVar1 = strcmp(argv[parm._4_4_],"-f");
              if (iVar1 == 0) {
                gRunInfo.schemaFullChecking = true;
                uVar2 = gRunInfo.numParses;
              }
              else {
                iVar1 = strcmp(argv[parm._4_4_],"-n");
                if (iVar1 == 0) {
                  gRunInfo.doNamespaces = true;
                  uVar2 = gRunInfo.numParses;
                }
                else {
                  iVar1 = strcmp(argv[parm._4_4_],"-p");
                  if (iVar1 == 0) {
                    gRunInfo.doNamespacePrefixes = true;
                    uVar2 = gRunInfo.numParses;
                  }
                  else {
                    iVar1 = strncmp(argv[parm._4_4_],"-parser=",8);
                    if (iVar1 == 0) {
                      pcVar3 = argv[parm._4_4_] + 8;
                      iVar1 = strcmp(pcVar3,"dom");
                      if (iVar1 == 0) {
                        gRunInfo.dom = true;
                        gRunInfo.sax = false;
                        uVar2 = gRunInfo.numParses;
                      }
                      else {
                        iVar1 = strcmp(pcVar3,"sax");
                        if (iVar1 == 0) {
                          gRunInfo.sax = true;
                        }
                        else {
                          iVar1 = strcmp(pcVar3,"sax2");
                          if (iVar1 != 0) {
                            fprintf(_stderr,"Unrecognized -parser option \"%s\"\n",pcVar3);
                            puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                            *puVar4 = 1;
                            __cxa_throw(puVar4,&int::typeinfo,0);
                          }
                          gRunInfo.sax = false;
                        }
                        gRunInfo.dom = false;
                        uVar2 = gRunInfo.numParses;
                      }
                    }
                    else {
                      iVar1 = strcmp(argv[parm._4_4_],"-init");
                      if (iVar1 == 0) {
                        gRunInfo.doInitialParse = true;
                        uVar2 = gRunInfo.numParses;
                      }
                      else {
                        iVar1 = strcmp(argv[parm._4_4_],"-reuse");
                        if (iVar1 == 0) {
                          gRunInfo.reuseParser = true;
                          uVar2 = gRunInfo.numParses;
                        }
                        else {
                          iVar1 = strcmp(argv[parm._4_4_],"-dump");
                          if (iVar1 == 0) {
                            gRunInfo.dumpOnErr = true;
                            uVar2 = gRunInfo.numParses;
                          }
                          else {
                            iVar1 = strcmp(argv[parm._4_4_],"-mem");
                            if (iVar1 == 0) {
                              gRunInfo.inMemory = true;
                              uVar2 = gRunInfo.numParses;
                            }
                            else {
                              iVar1 = strcmp(argv[parm._4_4_],"-threads");
                              if (iVar1 == 0) {
                                parm._4_4_ = parm._4_4_ + 1;
                                if (argc <= parm._4_4_) {
                                  fprintf(_stderr,"Invalid -threads option (missing # of threads)\n"
                                         );
                                  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                                  *puVar4 = 1;
                                  __cxa_throw(puVar4,&int::typeinfo,0);
                                }
                                gRunInfo.numThreads = atoi(argv[parm._4_4_]);
                                uVar2 = gRunInfo.numParses;
                                if (gRunInfo.numThreads < 0) {
                                  fprintf(_stderr,
                                          "Invalid -threads option (negative # of threads)\n");
                                  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                                  *puVar4 = 1;
                                  __cxa_throw(puVar4,&int::typeinfo,0);
                                }
                              }
                              else {
                                iVar1 = strcmp(argv[parm._4_4_],"-time");
                                if (iVar1 == 0) {
                                  parm._4_4_ = parm._4_4_ + 1;
                                  if (argc <= parm._4_4_) {
                                    fprintf(_stderr,"Invalid -time option (missing time value)\n");
                                    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                                    *puVar4 = 1;
                                    __cxa_throw(puVar4,&int::typeinfo,0);
                                  }
                                  gRunInfo.totalTime = atoi(argv[parm._4_4_]);
                                  uVar2 = gRunInfo.numParses;
                                  if (gRunInfo.totalTime < 1) {
                                    fprintf(_stderr,"Invalid -time option (time value < 1)\n");
                                    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                                    *puVar4 = 1;
                                    __cxa_throw(puVar4,&int::typeinfo,0);
                                  }
                                }
                                else {
                                  iVar1 = strcmp(argv[parm._4_4_],"-gc");
                                  if (iVar1 == 0) {
                                    gRunInfo.doGrammarCaching = true;
                                    uVar2 = gRunInfo.numParses;
                                  }
                                  else {
                                    iVar1 = strcmp(argv[parm._4_4_],"-parses");
                                    if (iVar1 == 0) {
                                      parm._4_4_ = parm._4_4_ + 1;
                                      if (argc <= parm._4_4_) {
                                        fprintf(_stderr,
                                                "Invalid -parses option (missing # of parses)\n");
                                        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                                        *puVar4 = 1;
                                        __cxa_throw(puVar4,&int::typeinfo,0);
                                      }
                                      uVar2 = atoi(argv[parm._4_4_]);
                                      if ((int)uVar2 < 0) {
                                        fprintf(_stderr,
                                                "Invalid -parses option (negative # of parses)\n");
                                        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                                        *puVar4 = 1;
                                        __cxa_throw(puVar4,&int::typeinfo,0);
                                      }
                                    }
                                    else {
                                      if (*argv[parm._4_4_] == '-') {
                                        fprintf(_stderr,
                                                "Unrecognized command line option.  Scanning \"%s\"\n"
                                                ,argv[parm._4_4_]);
                                        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                                        *puVar4 = 1;
                                        __cxa_throw(puVar4,&int::typeinfo,0);
                                      }
                                      iVar1 = gRunInfo.numInputFiles + 1;
                                      if (0x18 < iVar1) {
                                        gRunInfo.numInputFiles = iVar1;
                                        fprintf(_stderr,"Too many input files.  Limit is %d\n",0x19)
                                        ;
                                        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
                                        *puVar4 = 1;
                                        __cxa_throw(puVar4,&int::typeinfo,0);
                                      }
                                      lVar5 = (long)gRunInfo.numInputFiles;
                                      gRunInfo.numInputFiles = iVar1;
                                      gRunInfo.files[lVar5].fileName = argv[parm._4_4_];
                                      uVar2 = gRunInfo.numParses;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    gRunInfo.numParses = uVar2;
    parm._4_4_ = parm._4_4_ + 1;
  } while( true );
}

Assistant:

void parseCommandLine(int argc, char **argv)
{
    gRunInfo.doGrammarCaching = false;
    gRunInfo.quiet = false;               // Set up defaults for run.
    gRunInfo.verbose = false;
    gRunInfo.stopNow = false;
    gRunInfo.dom = false;
    gRunInfo.sax = true;
    gRunInfo.reuseParser = false;
    gRunInfo.inMemory = false;
    gRunInfo.dumpOnErr = false;
    gRunInfo.doSchema = false;
    gRunInfo.schemaFullChecking = false;
    gRunInfo.doNamespaces = false;
    gRunInfo.doInitialParse = false;
    gRunInfo.doNamespacePrefixes = false;

    gRunInfo.valScheme = SAXParser::Val_Auto;
    gRunInfo.numThreads = 2;
    gRunInfo.totalTime = 0;
    gRunInfo.numInputFiles = 0;
    gRunInfo.numParses = 0;

    try             // Use exceptions for command line syntax errors.
    {
        int argnum = 1;
        while (argnum < argc) {
            if (strcmp(argv[argnum], "-quiet") == 0)
                gRunInfo.quiet = true;
            else if (strcmp(argv[argnum], "-verbose") == 0)
                gRunInfo.verbose = true;
            else if (strncmp(argv[argnum], "-v=", 3) == 0) {
                const char* const parm = &argv[argnum][3];
                if (!strcmp(parm, "never"))
                    gRunInfo.valScheme = SAXParser::Val_Never;
                else if (!strcmp(parm, "auto"))
                    gRunInfo.valScheme = SAXParser::Val_Auto;
                else if (!strcmp(parm, "always"))
                    gRunInfo.valScheme = SAXParser::Val_Always;
                else {
                    fprintf(stderr, "Unrecognized -v option \"%s\"\n", parm);
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-v") == 0) {
                fprintf(stderr, "Please note the -v option has been changed to -v=[always | never | auto]\n");
                fprintf(stderr, "ThreadTest will continue with -v=always\n");
                gRunInfo.valScheme = SAXParser::Val_Always;
            }
            else if (strcmp(argv[argnum], "-s") == 0)
                gRunInfo.doSchema = true;
            else if (strcmp(argv[argnum], "-f") == 0)
                gRunInfo.schemaFullChecking = true;
            else if (strcmp(argv[argnum], "-n") == 0)
                gRunInfo.doNamespaces = true;
            else if (strcmp(argv[argnum], "-p") == 0)
                gRunInfo.doNamespacePrefixes = true;
            else if (!strncmp(argv[argnum], "-parser=", 8)) {
                const char* const parm = &argv[argnum][8];
                if (!strcmp(parm, "dom")) {
                    gRunInfo.dom = true;
                    gRunInfo.sax = false;
                }
                else if (!strcmp(parm, "sax")) {
                    gRunInfo.dom = false;
                    gRunInfo.sax = true;
                }
                else if (!strcmp(parm, "sax2")) {
                    gRunInfo.dom = false;
                    gRunInfo.sax = false;
                }
                else {
                    fprintf(stderr, "Unrecognized -parser option \"%s\"\n", parm);
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-init") == 0)
                gRunInfo.doInitialParse = true;
            else if (strcmp(argv[argnum], "-reuse") == 0)
                gRunInfo.reuseParser = true;
            else if (strcmp(argv[argnum], "-dump") == 0)
                gRunInfo.dumpOnErr = true;
            else if (strcmp(argv[argnum], "-mem") == 0)
                gRunInfo.inMemory = true;
            else if (strcmp(argv[argnum], "-threads") == 0) {
                ++argnum;
                if (argnum >= argc) {
                    fprintf(stderr, "Invalid -threads option (missing # of threads)\n");
                    throw 1;
                }
                gRunInfo.numThreads = atoi(argv[argnum]);
                if (gRunInfo.numThreads < 0) {
                    fprintf(stderr, "Invalid -threads option (negative # of threads)\n");
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-time") == 0) {
                ++argnum;
                if (argnum >= argc) {
                    fprintf(stderr, "Invalid -time option (missing time value)\n");
                    throw 1;
                }
                gRunInfo.totalTime = atoi(argv[argnum]);
                if (gRunInfo.totalTime < 1) {
                    fprintf(stderr, "Invalid -time option (time value < 1)\n");
                    throw 1;
                }
            }
            else if (strcmp(argv[argnum], "-gc") == 0)
                gRunInfo.doGrammarCaching = true;
            else if (strcmp(argv[argnum], "-parses") == 0) {
                ++argnum;
                if (argnum >= argc) {
                    fprintf(stderr, "Invalid -parses option (missing # of parses)\n");
                    throw 1;
                }
                int temp = atoi(argv[argnum]);
                if (temp < 0) {
                    fprintf(stderr, "Invalid -parses option (negative # of parses)\n");
                    throw 1;
                }
                gRunInfo.numParses = temp;
            }
            else  if (argv[argnum][0] == '-') {
                fprintf(stderr, "Unrecognized command line option.  Scanning \"%s\"\n",
                    argv[argnum]);
                throw 1;
            }
            else {
                gRunInfo.numInputFiles++;
                if (gRunInfo.numInputFiles >= MAXINFILES) {
                    fprintf(stderr, "Too many input files.  Limit is %d\n", MAXINFILES);
                    throw 1;
                }
                gRunInfo.files[gRunInfo.numInputFiles-1].fileName = argv[argnum];
            }
            argnum++;
        }

        // We've made it through the command line.
        // Verify that at least one input file to be parsed was specified.
        if (gRunInfo.numInputFiles == 0) {
            fprintf(stderr, "No input XML file specified on command line.\n");
            throw 1;
        };

        if (gRunInfo.numParses && gRunInfo.totalTime) {
            fprintf(stderr, "Both -parses nnn and -time nnn were specified. Ignoring -time nnn.\n");
        }
    }
    catch (int)
    {
        fprintf(stderr, "usage:  ThreadTest [-v] [-threads nnn] [-time nnn] [-quiet] [-verbose] xmlfile...\n"
            "     -v=xxx         Validation scheme [always | never | auto].  Default is AUTO.\n"
            "     -n             Enable namespace processing. Defaults to off.\n"
            "     -s             Enable schema processing. Defaults to off.\n"
            "     -f             Enable full schema constraint checking. Defaults to off.\n"
            "     -parser=xxx    Parser Type [dom | sax | sax2].  Default is SAX (SAX1).\n"
            "     -p             Enable namespace prefixes. Defaults to off.\n"
            "                    (Only used with -parser=sax2, ignored otherwise.)\n"
            "     -quiet         Suppress periodic status display.\n"
            "     -verbose       Display extra messages.\n"
            "     -reuse         Retain and reuse parser.  Default creates new for each parse.\n"
            "     -threads nnn   Number of threads.  Default is 2.\n"
            "     -time nnn      Total time to run, in seconds.  Default is forever.\n"
            "     -parses nnn    Run for nnn parses instead of time.  Default is to use time\n"
            "     -dump          Dump DOM tree on error.\n"
            "     -mem           Read files into memory once only, and parse them from there.\n"
            "     -gc            Enable grammar caching (i.e. grammar cached and used in subsequent parses). Defaults to off.\n"
            "     -init          Perform an initial parse of the file(s) before starting up the individual threads.\n\n"
            );
        exit(1);
    }
}